

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_sse42.c
# Opt level: O3

uint32_t adler32_fold_copy_sse42(uint32_t adler,uint8_t *dst,uint8_t *src,size_t len)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 in_XMM3 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar17 [16];
  int iVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  auVar3 = _DAT_00120640;
  auVar2 = _DAT_00120620;
  uVar16 = adler & 0xffff;
  uVar24 = adler >> 0x10;
  auVar7 = pmovsxbw(in_XMM3,0x101010101010101);
  do {
    if (len < 0x10) {
      if (len != 0) {
        uVar4 = 0;
        do {
          bVar1 = (*(undefined1 (*) [16])src)[uVar4];
          (*(undefined1 (*) [16])dst)[uVar4] = bVar1;
          uVar16 = uVar16 + bVar1;
          uVar24 = uVar24 + uVar16;
          uVar4 = uVar4 + 1;
        } while (len != uVar4);
      }
      return (uVar24 % 0xfff1) * 0x10000 | uVar16 % 0xfff1;
    }
    do {
      uVar5 = 0x15b0;
      if (len < 0x15b0) {
        uVar5 = (uint)len;
      }
      uVar6 = (ulong)(uVar5 & 0x1ff0);
      iVar19 = 0;
      iVar21 = 0;
      iVar23 = 0;
      iVar25 = 0;
      iVar26 = 0;
      iVar27 = 0;
      iVar8 = 0;
      iVar9 = 0;
      iVar10 = 0;
      iVar11 = 0;
      uVar4 = uVar6;
      if (len < 0x20) {
        iVar12 = 0;
        iVar13 = 0;
        iVar14 = 0;
        iVar15 = 0;
        iVar28 = 0;
        iVar29 = 0;
        iVar30 = 0;
        iVar31 = 0;
      }
      else {
        iVar28 = 0;
        iVar29 = 0;
        iVar30 = 0;
        iVar31 = 0;
        iVar12 = 0;
        iVar13 = 0;
        iVar14 = 0;
        iVar15 = 0;
        uVar5 = uVar16;
        iVar18 = iVar19;
        iVar20 = iVar21;
        iVar22 = iVar23;
        do {
          auVar32 = *(undefined1 (*) [16])src;
          auVar33 = *(undefined1 (*) [16])((long)src + 0x10);
          src = (uint8_t *)((long)src + 0x20);
          uVar4 = uVar4 - 0x20;
          auVar17 = psadbw(auVar32,(undefined1  [16])0x0);
          auVar34 = psadbw(auVar33,(undefined1  [16])0x0);
          *(undefined1 (*) [16])dst = auVar32;
          *(undefined1 (*) [16])((long)dst + 0x10) = auVar33;
          dst = (uint8_t *)((long)dst + 0x20);
          auVar32 = pmaddubsw(auVar32,auVar2);
          auVar33 = pmaddubsw(auVar33,auVar3);
          uVar16 = auVar17._0_4_ + uVar5 + auVar34._0_4_;
          iVar19 = auVar17._4_4_ + iVar18 + auVar34._4_4_;
          iVar21 = auVar17._8_4_ + iVar20 + auVar34._8_4_;
          iVar23 = auVar17._12_4_ + iVar22 + auVar34._12_4_;
          iVar12 = iVar12 + uVar5;
          iVar13 = iVar13 + iVar18;
          iVar14 = iVar14 + iVar20;
          iVar15 = iVar15 + iVar22;
          auVar32 = pmaddwd(auVar32,auVar7);
          uVar24 = uVar24 + auVar32._0_4_;
          iVar25 = iVar25 + auVar32._4_4_;
          iVar26 = iVar26 + auVar32._8_4_;
          iVar27 = iVar27 + auVar32._12_4_;
          auVar32 = pmaddwd(auVar33,auVar7);
          iVar28 = iVar28 + auVar32._0_4_;
          iVar29 = iVar29 + auVar32._4_4_;
          iVar30 = iVar30 + auVar32._8_4_;
          iVar31 = iVar31 + auVar32._12_4_;
          uVar5 = uVar16;
          iVar18 = iVar19;
          iVar20 = iVar21;
          iVar22 = iVar23;
        } while (0x1f < uVar4);
        iVar12 = iVar12 * 0x20;
        iVar13 = iVar13 * 0x20;
        iVar14 = iVar14 * 0x20;
        iVar15 = iVar15 * 0x20;
      }
      iVar28 = iVar12 + uVar24 + iVar28;
      iVar29 = iVar13 + iVar25 + iVar29;
      iVar30 = iVar14 + iVar26 + iVar30;
      iVar31 = iVar15 + iVar27 + iVar31;
      if (uVar4 != 0) {
        iVar8 = 0;
        iVar9 = 0;
        iVar10 = 0;
        iVar11 = 0;
        uVar24 = uVar16;
        iVar25 = iVar21;
        do {
          auVar32 = *(undefined1 (*) [16])src;
          src = (uint8_t *)((long)src + 0x10);
          *(undefined1 (*) [16])dst = auVar32;
          dst = (uint8_t *)((long)dst + 0x10);
          auVar33 = psadbw(auVar32,(undefined1  [16])0x0);
          auVar32 = pmaddubsw(auVar32,auVar3);
          uVar16 = auVar33._0_4_ + uVar24;
          iVar21 = auVar33._8_4_ + iVar25;
          iVar8 = iVar8 + uVar24;
          iVar9 = iVar9 + iVar19;
          iVar10 = iVar10 + iVar25;
          iVar11 = iVar11 + iVar23;
          auVar32 = pmaddwd(auVar32,auVar7);
          iVar28 = iVar28 + auVar32._0_4_;
          iVar29 = iVar29 + auVar32._4_4_;
          iVar30 = iVar30 + auVar32._8_4_;
          iVar31 = iVar31 + auVar32._12_4_;
          uVar4 = uVar4 - 0x10;
          uVar24 = uVar16;
          iVar19 = auVar33._4_4_ + iVar19;
          iVar25 = iVar21;
          iVar23 = auVar33._12_4_ + iVar23;
        } while (uVar4 != 0);
        iVar8 = iVar8 * 0x10;
        iVar9 = iVar9 * 0x10;
        iVar10 = iVar10 * 0x10;
        iVar11 = iVar11 * 0x10;
      }
      auVar32._0_4_ = iVar8 + iVar28;
      auVar32._4_4_ = iVar9 + iVar29;
      auVar32._8_4_ = iVar10 + iVar30;
      auVar32._12_4_ = iVar11 + iVar31;
      len = len - uVar6;
      auVar32 = phaddd(auVar32,auVar32);
      auVar32 = phaddd(auVar32,auVar32);
      uVar16 = (iVar21 + uVar16) % 0xfff1;
      uVar24 = auVar32._0_4_ % 0xfff1;
    } while (0xf < len);
  } while (len != 0);
  return uVar16 | uVar24 * 0x10000;
}

Assistant:

Z_INTERNAL uint32_t adler32_fold_copy_sse42(uint32_t adler, uint8_t *dst, const uint8_t *src, size_t len) {
    uint32_t adler0, adler1;
    adler1 = (adler >> 16) & 0xffff;
    adler0 = adler & 0xffff;

rem_peel:
    if (len < 16) {
       return adler32_copy_len_16(adler0, src, dst, len, adler1);
    }

    __m128i vbuf, vbuf_0;
    __m128i vs1_0, vs3, vs1, vs2, vs2_0, v_sad_sum1, v_short_sum2, v_short_sum2_0,
            v_sad_sum2, vsum2, vsum2_0;
    __m128i zero = _mm_setzero_si128();
    const __m128i dot2v = _mm_setr_epi8(32, 31, 30, 29, 28, 27, 26, 25, 24, 23, 22, 21, 20, 19, 18, 17);
    const __m128i dot2v_0 = _mm_setr_epi8(16, 15, 14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1);
    const __m128i dot3v = _mm_set1_epi16(1);
    size_t k;

    while (len >= 16) {

        k = MIN(len, NMAX);
        k -= k % 16;
        len -= k;

        vs1 = _mm_cvtsi32_si128(adler0);
        vs2 = _mm_cvtsi32_si128(adler1);

        vs3 = _mm_setzero_si128();
        vs2_0 = _mm_setzero_si128();
        vs1_0 = vs1;

        while (k >= 32) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_loadu_si128((__m128i*)src);
            vbuf_0 = _mm_loadu_si128((__m128i*)(src + 16));
            src += 32;
            k -= 32;

            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            v_sad_sum2 = _mm_sad_epu8(vbuf_0, zero);
            _mm_storeu_si128((__m128i*)dst, vbuf);
            _mm_storeu_si128((__m128i*)(dst + 16), vbuf_0);
            dst += 32;

            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v);
            v_short_sum2_0 = _mm_maddubs_epi16(vbuf_0, dot2v_0);

            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);

            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            vsum2_0 = _mm_madd_epi16(v_short_sum2_0, dot3v);
            vs1 = _mm_add_epi32(v_sad_sum2, vs1);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vs2_0 = _mm_add_epi32(vsum2_0, vs2_0);
            vs1_0 = vs1;
        }

        vs2 = _mm_add_epi32(vs2_0, vs2);
        vs3 = _mm_slli_epi32(vs3, 5);
        vs2 = _mm_add_epi32(vs3, vs2);
        vs3 = _mm_setzero_si128();

        while (k >= 16) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_loadu_si128((__m128i*)src);
            src += 16;
            k -= 16;

            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v_0);

            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);
            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vs1_0 = vs1;

            _mm_storeu_si128((__m128i*)dst, vbuf);
            dst += 16;
        }

        vs3 = _mm_slli_epi32(vs3, 4);
        vs2 = _mm_add_epi32(vs2, vs3);

        adler0 = partial_hsum(vs1) % BASE;
        adler1 = hsum(vs2) % BASE;
    }

    /* If this is true, there's fewer than 16 elements remaining */
    if (len) {
        goto rem_peel;
    }

    return adler0 | (adler1 << 16);
}